

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

wchar_t archive_write_mtree_header(archive_write *a,archive_entry *entry)

{
  undefined8 *puVar1;
  char *fn;
  size_t sVar2;
  bool bVar3;
  mtree_entry_conflict *me;
  archive_string *dest;
  mode_t mVar4;
  wchar_t wVar5;
  int iVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  la_int64_t lVar9;
  archive_entry *entry_00;
  time_t t;
  mtree_entry_conflict *pmVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar11;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  uint uVar12;
  char *__s2;
  long lVar13;
  mtree_entry_conflict *mtree_entry;
  mtree_entry_conflict *file;
  char name [256];
  mtree_entry_conflict *local_190;
  mtree_entry_conflict *local_188;
  wchar_t local_17c;
  archive_string local_178;
  archive_string *local_158;
  undefined8 *local_150;
  char *local_148;
  mtree_entry_conflict *local_140;
  char local_138 [264];
  
  puVar1 = (undefined8 *)a->format_data;
  if (*(int *)(puVar1 + 0xe) != 0) {
    *(undefined4 *)(puVar1 + 0xe) = 0;
    archive_strcat((archive_string *)(puVar1 + 0xb),"#mtree\n");
    if ((*(uint *)(puVar1 + 0x24) & 0x380238) == 0) {
      *(undefined4 *)((long)puVar1 + 300) = 0;
    }
  }
  lVar9 = archive_entry_size(entry);
  puVar1[0xf] = lVar9;
  if ((*(int *)((long)puVar1 + 0x124) != 0) &&
     (mVar4 = archive_entry_filetype(entry), mVar4 != 0x4000)) {
    return L'\0';
  }
  wVar5 = mtree_entry_new(a,entry,&local_188);
  me = local_188;
  if (wVar5 < L'\xffffffec') {
    return wVar5;
  }
  fn = (char *)a->format_data;
  sVar2 = (local_188->parentdir).length;
  local_150 = puVar1;
  if (sVar2 == 0) {
    if (((local_188->basename).length != 1) || (*(local_188->basename).s != '.')) {
      archive_set_error(&a->archive,-1,
                        "Internal programming error in generating canonical name for %s",
                        (local_188->pathname).s);
LAB_0017397f:
      wVar8 = L'\xffffffe7';
      goto LAB_00173e66;
    }
    local_188->parent = local_188;
    pmVar10 = *(mtree_entry_conflict **)(fn + 8);
    if (pmVar10 == (mtree_entry_conflict *)0x0) {
      *(mtree_entry_conflict **)(fn + 8) = local_188;
      local_188->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(fn + 0x38) = local_188;
      *(mtree_entry_conflict ***)(fn + 0x38) = &local_188->next;
      goto LAB_00173c92;
    }
  }
  else {
    __s2 = (local_188->parentdir).s;
    pcVar11 = extraout_RDX;
    if ((*(size_t *)(fn + 0x20) == sVar2) &&
       (iVar6 = strcmp(((archive_string *)(fn + 0x18))->s,__s2), pcVar11 = extraout_RDX_00,
       iVar6 == 0)) {
      iVar6 = __archive_rb_tree_insert_node
                        (*(archive_rb_tree **)(*(long *)(fn + 0x10) + 0x28),&me->rbnode);
      local_190 = *(mtree_entry_conflict **)(fn + 0x10);
joined_r0x00173bc9:
      if (iVar6 != 0) {
        me->parent = local_190;
        me->next = (mtree_entry_conflict *)0x0;
        **(undefined8 **)(fn + 0x38) = me;
        *(mtree_entry_conflict ***)(fn + 0x38) = &me->next;
LAB_00173c92:
        wVar8 = L'\0';
        goto LAB_00173e66;
      }
      pmVar10 = (mtree_entry_conflict *)
                __archive_rb_tree_find_node(&local_190->dir_info->rbtree,(me->basename).s);
    }
    else {
      local_190 = *(mtree_entry_conflict **)(fn + 8);
      local_158 = (archive_string *)(fn + 0x18);
      wVar7 = get_path_component(local_138,(size_t)__s2,pcVar11);
      local_148 = __s2;
      if (wVar7 == L'\0') {
        pmVar10 = (mtree_entry_conflict *)0x0;
      }
      else {
        pcVar11 = extraout_RDX_01;
        do {
          while( true ) {
            if (wVar7 < L'\0') {
              archive_set_error(&a->archive,-1,"A name buffer is too small");
              wVar8 = L'\xffffffe2';
              goto LAB_00173e66;
            }
            if ((((wVar7 != L'\x01') || (local_138[0] != '.')) ||
                (local_190 == (mtree_entry_conflict *)0x0)) ||
               (local_190 != *(mtree_entry_conflict **)(fn + 8))) break;
            if (__s2[1] == '/') {
              __s2 = __s2 + 2;
            }
            else {
              __s2 = __s2 + 1;
            }
            wVar7 = get_path_component(local_138,(size_t)__s2,pcVar11);
            pcVar11 = extraout_RDX_02;
            if (wVar7 == L'\0') goto LAB_0017390a;
          }
          if (local_190 == (mtree_entry_conflict *)0x0) {
            pmVar10 = (mtree_entry_conflict *)0x0;
          }
          else {
            pmVar10 = (mtree_entry_conflict *)
                      __archive_rb_tree_find_node(&local_190->dir_info->rbtree,local_138);
            pcVar11 = extraout_RDX_03;
          }
          if (pmVar10 == (mtree_entry_conflict *)0x0) break;
          if (*__s2 == '\0') goto LAB_00173994;
          if (pmVar10->dir_info == (dir_info *)0x0) {
            archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",
                              (pmVar10->pathname).s,(me->pathname).s);
            goto LAB_0017397f;
          }
          __s2 = __s2 + (ulong)(__s2[(uint)wVar7] == '/') + (ulong)(uint)wVar7;
          wVar7 = get_path_component(local_138,(size_t)__s2,pcVar11);
          pcVar11 = extraout_RDX_04;
          local_190 = pmVar10;
        } while (wVar7 != L'\0');
LAB_0017390a:
        pmVar10 = (mtree_entry_conflict *)0x0;
      }
LAB_00173994:
      if (pmVar10 == (mtree_entry_conflict *)0x0) {
        do {
          dest = local_158;
          if (*__s2 == '\0') {
            *(mtree_entry_conflict **)(fn + 0x10) = local_190;
            fn[0x20] = '\0';
            fn[0x21] = '\0';
            fn[0x22] = '\0';
            fn[0x23] = '\0';
            fn[0x24] = '\0';
            fn[0x25] = '\0';
            fn[0x26] = '\0';
            fn[0x27] = '\0';
            archive_string_ensure
                      (local_158,(local_190->parentdir).length + (local_190->basename).length + 2);
            sVar2 = (local_190->parentdir).length;
            if ((local_190->basename).length + sVar2 == 0) {
              *dest->s = '\0';
            }
            else {
              if (sVar2 != 0) {
                fn[0x20] = '\0';
                fn[0x21] = '\0';
                fn[0x22] = '\0';
                fn[0x23] = '\0';
                fn[0x24] = '\0';
                fn[0x25] = '\0';
                fn[0x26] = '\0';
                fn[0x27] = '\0';
                archive_string_concat(dest,&local_190->parentdir);
                archive_strappend_char(dest,'/');
              }
              archive_string_concat(dest,&local_190->basename);
            }
            iVar6 = __archive_rb_tree_insert_node(&local_190->dir_info->rbtree,&me->rbnode);
            goto joined_r0x00173bc9;
          }
          lVar13 = (long)wVar7;
          local_178.s = (char *)0x0;
          local_178.length = 0;
          local_178.buffer_length = 0;
          archive_strncat(&local_178,local_148,(size_t)(__s2 + (lVar13 - (long)local_148)));
          pcVar11 = local_178.s;
          if (local_178.s[local_178.length - 1] == '/') {
            local_178.s[local_178.length - 1] = '\0';
            local_178.length = local_178.length - 1;
          }
          entry_00 = archive_entry_new();
          if (entry_00 == (archive_entry *)0x0) {
LAB_00173a57:
            archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
            wVar8 = L'\xffffffe2';
            bVar3 = true;
            pmVar10 = (mtree_entry_conflict *)0x0;
          }
          else {
            archive_entry_copy_pathname(entry_00,pcVar11);
            archive_entry_set_mode(entry_00,0x41ed);
            t = time((time_t *)0x0);
            archive_entry_set_mtime(entry_00,t,0);
            wVar8 = mtree_entry_new(a,entry_00,&local_140);
            archive_entry_free(entry_00);
            if (wVar8 < L'\xffffffec') goto LAB_00173a57;
            local_140->dir_info->virtual = L'\x01';
            bVar3 = false;
            wVar8 = L'\0';
            pmVar10 = local_140;
          }
          archive_string_free(&local_178);
          if (bVar3) {
            bVar3 = false;
          }
          else {
            iVar6 = strcmp((pmVar10->pathname).s,".");
            if (iVar6 == 0) {
              pmVar10->parent = pmVar10;
              *(mtree_entry_conflict **)(fn + 8) = pmVar10;
            }
            else {
              __archive_rb_tree_insert_node(&local_190->dir_info->rbtree,&pmVar10->rbnode);
              pmVar10->parent = local_190;
            }
            pmVar10->next = (mtree_entry_conflict *)0x0;
            **(undefined8 **)(fn + 0x38) = pmVar10;
            *(mtree_entry_conflict ***)(fn + 0x38) = &pmVar10->next;
            __s2 = __s2 + (ulong)(__s2[lVar13] == '/') + lVar13;
            wVar7 = get_path_component(local_138,(size_t)__s2,fn);
            if (wVar7 < L'\0') {
              archive_string_free(&local_178);
              bVar3 = false;
              wVar7 = L'\xffffffff';
              archive_set_error(&a->archive,-1,"A name buffer is too small");
              wVar8 = L'\xffffffe2';
            }
            else {
              bVar3 = true;
              wVar8 = local_17c;
              local_190 = pmVar10;
            }
          }
          local_17c = wVar8;
        } while (bVar3);
        goto LAB_00173e66;
      }
    }
  }
  uVar12 = me->mode ^ pmVar10->mode;
  if ((uVar12 & 0xf000) == 0) {
    (pmVar10->symlink).length = 0;
    archive_string_concat(&pmVar10->symlink,&me->symlink);
    (pmVar10->uname).length = 0;
    archive_string_concat(&pmVar10->uname,&me->uname);
    (pmVar10->gname).length = 0;
    archive_string_concat(&pmVar10->gname,&me->gname);
    (pmVar10->fflags_text).length = 0;
    archive_string_concat(&pmVar10->fflags_text,&me->fflags_text);
    pmVar10->nlink = me->nlink;
    pmVar10->filetype = me->filetype;
    pmVar10->mode = me->mode;
    pmVar10->size = me->size;
    pmVar10->uid = me->uid;
    pmVar10->gid = me->gid;
    pmVar10->fflags_set = me->fflags_set;
    pmVar10->fflags_clear = me->fflags_clear;
    pmVar10->mtime = me->mtime;
    pmVar10->mtime_nsec = me->mtime_nsec;
    pmVar10->rdevmajor = me->rdevmajor;
    pmVar10->rdevminor = me->rdevminor;
    pmVar10->devmajor = me->devmajor;
    pmVar10->devminor = me->devminor;
    pmVar10->ino = me->ino;
    wVar8 = L'\xffffffec';
  }
  else {
    archive_set_error(&a->archive,-1,"Found duplicate entries `%s\' and its file type is different",
                      (pmVar10->pathname).s);
    wVar8 = L'\xffffffe7';
  }
  if ((uVar12 & 0xf000) == 0) {
    if (pmVar10->dir_info != (dir_info *)0x0) {
      pmVar10->dir_info->virtual = L'\0';
    }
    local_188 = pmVar10;
    mtree_entry_free(me);
    wVar8 = L'\xffffffec';
  }
LAB_00173e66:
  puVar1 = local_150;
  if (wVar8 < L'\xffffffec') {
    mtree_entry_free(local_188);
    wVar5 = wVar8;
  }
  else {
    *local_150 = local_188;
    if (local_188->reg_info != (reg_info *)0x0) {
      *(undefined4 *)(local_150 + 0x1c) = 0;
      if ((*(uint *)(local_150 + 0x24) & 1) != 0) {
        local_150[0x1c] = 1;
        local_150[0x1d] = 0;
      }
      if ((*(uint *)(local_150 + 0x24) >> 8 & 1) != 0) {
        iVar6 = __archive_md5init((archive_md5_ctx *)(local_150 + 0x1e));
        if (iVar6 == 0) {
          *(byte *)((long)puVar1 + 0xe1) = *(byte *)((long)puVar1 + 0xe1) | 1;
        }
        else {
          *(byte *)((long)puVar1 + 0x121) = *(byte *)((long)puVar1 + 0x121) & 0xfe;
        }
      }
      if ((*(byte *)((long)puVar1 + 0x121) & 0x20) != 0) {
        iVar6 = __archive_ripemd160init((archive_rmd160_ctx *)(puVar1 + 0x1f));
        if (iVar6 == 0) {
          *(byte *)((long)puVar1 + 0xe1) = *(byte *)((long)puVar1 + 0xe1) | 0x20;
        }
        else {
          *(byte *)((long)puVar1 + 0x121) = *(byte *)((long)puVar1 + 0x121) & 0xdf;
        }
      }
      if ((*(byte *)((long)puVar1 + 0x121) & 0x40) != 0) {
        iVar6 = __archive_sha1init((archive_sha1_ctx *)(puVar1 + 0x20));
        if (iVar6 == 0) {
          *(byte *)((long)puVar1 + 0xe1) = *(byte *)((long)puVar1 + 0xe1) | 0x40;
        }
        else {
          *(byte *)((long)puVar1 + 0x121) = *(byte *)((long)puVar1 + 0x121) & 0xbf;
        }
      }
      if ((*(byte *)((long)puVar1 + 0x122) & 0x80) != 0) {
        iVar6 = __archive_sha256init((archive_sha256_ctx *)(puVar1 + 0x21));
        if (iVar6 == 0) {
          *(byte *)((long)puVar1 + 0xe2) = *(byte *)((long)puVar1 + 0xe2) | 0x80;
        }
        else {
          *(byte *)((long)puVar1 + 0x122) = *(byte *)((long)puVar1 + 0x122) & 0x7f;
        }
      }
      if ((*(byte *)((long)puVar1 + 0x123) & 1) != 0) {
        iVar6 = __archive_sha384init((archive_sha384_ctx *)(puVar1 + 0x22));
        if (iVar6 == 0) {
          *(byte *)((long)puVar1 + 0xe3) = *(byte *)((long)puVar1 + 0xe3) | 1;
        }
        else {
          *(byte *)((long)puVar1 + 0x123) = *(byte *)((long)puVar1 + 0x123) & 0xfe;
        }
      }
      if ((*(byte *)((long)puVar1 + 0x123) & 2) != 0) {
        iVar6 = __archive_sha512init((archive_sha512_ctx *)(puVar1 + 0x23));
        if (iVar6 == 0) {
          *(byte *)((long)puVar1 + 0xe3) = *(byte *)((long)puVar1 + 0xe3) | 2;
        }
        else {
          *(byte *)((long)puVar1 + 0x123) = *(byte *)((long)puVar1 + 0x123) & 0xfd;
        }
      }
    }
  }
  return wVar5;
}

Assistant:

static int
archive_write_mtree_header(struct archive_write *a,
    struct archive_entry *entry)
{
	struct mtree_writer *mtree= a->format_data;
	struct mtree_entry *mtree_entry;
	int r, r2;

	if (mtree->first) {
		mtree->first = 0;
		archive_strcat(&mtree->buf, "#mtree\n");
		if ((mtree->keys & SET_KEYS) == 0)
			mtree->output_global_set = 0;/* Disabled. */
	}

	mtree->entry_bytes_remaining = archive_entry_size(entry);

	/* While directory only mode, we do not handle non directory files. */
	if (mtree->dironly && archive_entry_filetype(entry) != AE_IFDIR)
		return (ARCHIVE_OK);

	r2 = mtree_entry_new(a, entry, &mtree_entry);
	if (r2 < ARCHIVE_WARN)
		return (r2);
	r = mtree_entry_tree_add(a, &mtree_entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(mtree_entry);
		return (r);
	}
	mtree->mtree_entry = mtree_entry;

	/* If the current file is a regular file, we have to
	 * compute the sum of its content.
	 * Initialize a bunch of checksum context. */
	if (mtree_entry->reg_info)
		sum_init(mtree);

	return (r2);
}